

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
pstore::brokerface::subscriber<pstore::descriptor_condition_variable>::subscriber
          (subscriber<pstore::descriptor_condition_variable> *this,
          not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*> c)

{
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&this->queue_)
  ;
  this->owner_ = c.ptr_;
  this->active_ = true;
  return;
}

Assistant:

explicit subscriber (gsl::not_null<channel<ConditionVariable> *> c) noexcept
                    : owner_{c} {}